

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mat.cpp
# Opt level: O1

Mat operator+(Mat *left,Mat *right)

{
  int iVar1;
  int iVar2;
  double *pdVar3;
  double *pdVar4;
  ostream *poVar5;
  double *in_RDX;
  double *extraout_RDX;
  double *pdVar6;
  uint uVar7;
  ulong uVar8;
  Mat MVar9;
  
  iVar1 = right->n_rows_;
  if ((iVar1 == *(int *)in_RDX) && (iVar2 = right->n_cols_, iVar2 == *(int *)((long)in_RDX + 4))) {
    left->n_rows_ = iVar1;
    left->n_cols_ = iVar2;
    uVar7 = iVar2 * iVar1;
    if ((int)uVar7 < 1) {
      pdVar4 = (double *)0x0;
      pdVar6 = in_RDX;
    }
    else {
      pdVar4 = (double *)operator_new__((ulong)uVar7 * 8);
      pdVar6 = extraout_RDX;
    }
    left->v_ = pdVar4;
    if (0 < (int)uVar7) {
      pdVar3 = right->v_;
      pdVar6 = (double *)in_RDX[1];
      uVar8 = 0;
      do {
        pdVar4[uVar8] = pdVar3[uVar8] + pdVar6[uVar8];
        uVar8 = uVar8 + 1;
      } while (uVar7 != uVar8);
    }
    MVar9.v_ = pdVar6;
    MVar9._0_8_ = left;
    return MVar9;
  }
  poVar5 = std::operator<<((ostream *)&std::cerr,"ERROR: Incompatible shape in +(Matrix,Matrix)");
  std::endl<char,std::char_traits<char>>(poVar5);
  exit(1);
}

Assistant:

Mat operator + (const Mat& left, const Mat& right)
{
	if ( (left.n_rows_!=right.n_rows_) || (left.n_cols_!=right.n_cols_) ) {
		cerr << "ERROR: Incompatible shape in +(Matrix,Matrix)" << endl;
		exit(1);
	};
	Mat Aux(left.n_rows_,left.n_cols_);
	for (int i=0; i<left.n_rows_*left.n_cols_; i++) 	
		Aux.v_[i] = left.v_[i] + right.v_[i];
	return Aux;
}